

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_open_address_hash_dictionary_handler.c
# Opt level: O2

void test_open_address_hashmap_handler_function_registration(planck_unit_test_t *tc)

{
  planck_unit_result_t pVar1;
  ion_dictionary_handler_t map_handler;
  
  oadict_init(&map_handler);
  pVar1 = planck_unit_assert_true
                    (tc,(uint)(map_handler.insert == oadict_insert),0x60,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash_dictionary_handler.c"
                     ,"condition was false, expected true");
  if (pVar1 != '\0') {
    pVar1 = planck_unit_assert_true
                      (tc,(uint)(map_handler.create_dictionary == oadict_create_dictionary),0x61,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash_dictionary_handler.c"
                       ,"condition was false, expected true");
    if (pVar1 != '\0') {
      pVar1 = planck_unit_assert_true
                        (tc,(uint)(map_handler.update == oadict_update),0x62,
                         "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash_dictionary_handler.c"
                         ,"condition was false, expected true");
      if (pVar1 != '\0') {
        pVar1 = planck_unit_assert_true
                          (tc,(uint)(map_handler.remove == oadict_delete),99,
                           "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash_dictionary_handler.c"
                           ,"condition was false, expected true");
        if (pVar1 != '\0') {
          pVar1 = planck_unit_assert_true
                            (tc,(uint)(map_handler.delete_dictionary == oadict_delete_dictionary),
                             100,
                             "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash_dictionary_handler.c"
                             ,"condition was false, expected true");
          if (pVar1 != '\0') {
            return;
          }
        }
      }
    }
  }
  longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
}

Assistant:

void
test_open_address_hashmap_handler_function_registration(
	planck_unit_test_t *tc
) {
	ion_dictionary_handler_t map_handler;	/* create handler for hashmap */

	oadict_init(&map_handler);	/* register handler for hashmap */

	/* check to ensure that function pointers are correctly registered */
	PLANCK_UNIT_ASSERT_TRUE(tc, map_handler.insert == &oadict_insert);
	PLANCK_UNIT_ASSERT_TRUE(tc, map_handler.create_dictionary == &oadict_create_dictionary);
	PLANCK_UNIT_ASSERT_TRUE(tc, map_handler.update == &oadict_update);
	PLANCK_UNIT_ASSERT_TRUE(tc, map_handler.remove == &oadict_delete);
	PLANCK_UNIT_ASSERT_TRUE(tc, map_handler.delete_dictionary == &oadict_delete_dictionary);
}